

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<SubdirsMetaMakefileGenerator::Subdir_*>::data
          (QList<SubdirsMetaMakefileGenerator::Subdir_*> *this)

{
  QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*> *this_00;
  Subdir **ppSVar1;
  QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*> *in_RDI;
  
  detach((QList<SubdirsMetaMakefileGenerator::Subdir_*> *)0x1e2eac);
  this_00 = (QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*> *)
            QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*>::operator->(in_RDI);
  ppSVar1 = QArrayDataPointer<SubdirsMetaMakefileGenerator::Subdir_*>::data(this_00);
  return ppSVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }